

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int local_28;
  int local_24;
  int subset;
  int ret;
  int a;
  int i;
  char **argv_local;
  int argc_local;
  
  local_28 = 0;
  initializeLibxml2();
  for (subset = 1; subset < argc; subset = subset + 1) {
    iVar1 = strcmp(argv[subset],"-v");
    if (iVar1 == 0) {
      verbose = 1;
    }
    else {
      iVar1 = strcmp(argv[subset],"-u");
      if (iVar1 == 0) {
        update_results = 1;
      }
      else {
        iVar1 = strcmp(argv[subset],"-quiet");
        if (iVar1 == 0) {
          tests_quiet = 1;
        }
        else {
          iVar1 = strcmp(argv[subset],"--out");
          if (iVar1 == 0) {
            subset = subset + 1;
            temp_directory = argv[subset];
          }
          else {
            ret = 0;
            while (testDescriptions[ret].func != (functest)0x0) {
              pcVar2 = strstr(testDescriptions[ret].desc,argv[subset]);
              if (pcVar2 != (char *)0x0) {
                runtest(ret);
                local_28 = local_28 + 1;
              }
              ret = ret + 1;
            }
          }
        }
      }
    }
  }
  if (local_28 == 0) {
    ret = 0;
    while (testDescriptions[ret].func != (functest)0x0) {
      runtest(ret);
      ret = ret + 1;
    }
  }
  if ((nb_errors == 0) && (nb_leaks == 0)) {
    local_24 = 0;
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  else {
    local_24 = 1;
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,
           (ulong)(uint)nb_leaks);
  }
  xmlCleanupParser();
  return local_24;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

#if defined(_WIN32)
    setvbuf(stdout, NULL, _IONBF, 0);
    setvbuf(stderr, NULL, _IONBF, 0);
#endif

#if defined(_MSC_VER) && _MSC_VER >= 1400 && _MSC_VER < 1900
    _set_output_format(_TWO_DIGIT_EXPONENT);
#endif

    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-u"))
	    update_results = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "--out"))
	    temp_directory = argv[++a];
	else {
	    for (i = 0; testDescriptions[i].func != NULL; i++) {
	        if (strstr(testDescriptions[i].desc, argv[a])) {
		    ret += runtest(i);
		    subset++;
		}
	    }
	}
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}